

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.h
# Opt level: O0

bool llvm::dwarf::isType(Tag T)

{
  undefined1 local_9;
  Tag T_local;
  
  if (T == DW_TAG_null) {
    local_9 = false;
  }
  else if (T == DW_TAG_array_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_class_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_entry_point) {
    local_9 = false;
  }
  else if (T == DW_TAG_enumeration_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_formal_parameter) {
    local_9 = false;
  }
  else if (T == DW_TAG_imported_declaration) {
    local_9 = false;
  }
  else if (T == DW_TAG_label) {
    local_9 = false;
  }
  else if (T == DW_TAG_lexical_block) {
    local_9 = false;
  }
  else if (T == DW_TAG_member) {
    local_9 = false;
  }
  else if (T == DW_TAG_pointer_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_reference_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_compile_unit) {
    local_9 = false;
  }
  else if (T == DW_TAG_string_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_structure_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_subroutine_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_typedef) {
    local_9 = true;
  }
  else if (T == DW_TAG_union_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_unspecified_parameters) {
    local_9 = false;
  }
  else if (T == DW_TAG_variant) {
    local_9 = false;
  }
  else if (T == DW_TAG_common_block) {
    local_9 = false;
  }
  else if (T == DW_TAG_common_inclusion) {
    local_9 = false;
  }
  else if (T == DW_TAG_inheritance) {
    local_9 = false;
  }
  else if (T == DW_TAG_inlined_subroutine) {
    local_9 = false;
  }
  else if (T == DW_TAG_module) {
    local_9 = false;
  }
  else if (T == DW_TAG_ptr_to_member_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_set_type) {
    local_9 = false;
  }
  else if (T == DW_TAG_subrange_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_with_stmt) {
    local_9 = false;
  }
  else if (T == DW_TAG_access_declaration) {
    local_9 = false;
  }
  else if (T == DW_TAG_base_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_catch_block) {
    local_9 = false;
  }
  else if (T == DW_TAG_const_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_constant) {
    local_9 = false;
  }
  else if (T == DW_TAG_enumerator) {
    local_9 = false;
  }
  else if (T == DW_TAG_file_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_friend) {
    local_9 = false;
  }
  else if (T == DW_TAG_namelist) {
    local_9 = false;
  }
  else if (T == DW_TAG_namelist_item) {
    local_9 = false;
  }
  else if (T == DW_TAG_packed_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_subprogram) {
    local_9 = false;
  }
  else if (T == DW_TAG_template_type_parameter) {
    local_9 = false;
  }
  else if (T == DW_TAG_template_value_parameter) {
    local_9 = false;
  }
  else if (T == DW_TAG_thrown_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_try_block) {
    local_9 = false;
  }
  else if (T == DW_TAG_variant_part) {
    local_9 = false;
  }
  else if (T == DW_TAG_variable) {
    local_9 = false;
  }
  else if (T == DW_TAG_volatile_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_dwarf_procedure) {
    local_9 = false;
  }
  else if (T == DW_TAG_restrict_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_interface_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_namespace) {
    local_9 = false;
  }
  else if (T == DW_TAG_imported_module) {
    local_9 = false;
  }
  else if (T == DW_TAG_unspecified_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_partial_unit) {
    local_9 = false;
  }
  else if (T == DW_TAG_imported_unit) {
    local_9 = false;
  }
  else if (T == DW_TAG_condition) {
    local_9 = false;
  }
  else if (T == DW_TAG_shared_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_type_unit) {
    local_9 = false;
  }
  else if (T == DW_TAG_rvalue_reference_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_template_alias) {
    local_9 = false;
  }
  else if (T == DW_TAG_coarray_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_generic_subrange) {
    local_9 = false;
  }
  else if (T == DW_TAG_dynamic_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_atomic_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_call_site) {
    local_9 = false;
  }
  else if (T == DW_TAG_call_site_parameter) {
    local_9 = false;
  }
  else if (T == DW_TAG_skeleton_unit) {
    local_9 = false;
  }
  else if (T == DW_TAG_immutable_type) {
    local_9 = true;
  }
  else if (T == DW_TAG_MIPS_loop) {
    local_9 = false;
  }
  else if (T == DW_TAG_format_label) {
    local_9 = false;
  }
  else if (T == DW_TAG_function_template) {
    local_9 = false;
  }
  else if (T == DW_TAG_class_template) {
    local_9 = false;
  }
  else if (T == DW_TAG_GNU_template_template_param) {
    local_9 = false;
  }
  else if (T == DW_TAG_GNU_template_parameter_pack) {
    local_9 = false;
  }
  else if (T == DW_TAG_GNU_formal_parameter_pack) {
    local_9 = false;
  }
  else if (T == DW_TAG_GNU_call_site) {
    local_9 = false;
  }
  else if (T == DW_TAG_GNU_call_site_parameter) {
    local_9 = false;
  }
  else if (T == DW_TAG_APPLE_property) {
    local_9 = false;
  }
  else if (T == DW_TAG_BORLAND_property) {
    local_9 = false;
  }
  else if (T == DW_TAG_BORLAND_Delphi_string) {
    local_9 = true;
  }
  else if (T == DW_TAG_BORLAND_Delphi_dynamic_array) {
    local_9 = true;
  }
  else if (T == DW_TAG_BORLAND_Delphi_set) {
    local_9 = true;
  }
  else if (T == DW_TAG_BORLAND_Delphi_variant) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

inline bool isType(Tag T) {
  switch (T) {
  default:
    return false;
#define HANDLE_DW_TAG(ID, NAME, VERSION, VENDOR, KIND)                         \
  case DW_TAG_##NAME:                                                          \
    return (KIND == DW_KIND_TYPE);
#include "llvm/BinaryFormat/Dwarf.def"
  }
}